

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPPacket::RTPPacket
          (RTPPacket *this,uint8_t payloadtype,void *payloaddata,size_t payloadlen,uint16_t seqnr,
          uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,uint32_t *csrcs,
          bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,void *extensiondata,
          size_t maxpacksize,RTPMemoryManager *mgr)

{
  int iVar1;
  
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPPacket_0013cb80;
  (this->receivetime).m_t = 0.0;
  this->hasextension = false;
  this->hasmarker = false;
  this->numcsrcs = 0;
  this->payloadtype = '\0';
  this->extseqnr = 0;
  this->timestamp = 0;
  this->ssrc = 0;
  this->error = 0;
  this->packet = (uint8_t *)0x0;
  this->payload = (uint8_t *)0x0;
  this->packetlength = 0;
  this->payloadlength = 0;
  this->extid = 0;
  this->extension = (uint8_t *)0x0;
  this->extensionlength = 0;
  this->externalbuffer = false;
  iVar1 = BuildPacket(this,payloadtype,payloaddata,payloadlen,seqnr,timestamp,ssrc,gotmarker,
                      numcsrcs,csrcs,gotextension,extensionid,extensionlen_numwords,extensiondata,
                      (void *)0x0,maxpacksize);
  this->error = iVar1;
  return;
}

Assistant:

RTPPacket::RTPPacket(uint8_t payloadtype,const void *payloaddata,size_t payloadlen,uint16_t seqnr,
		  uint32_t timestamp,uint32_t ssrc,bool gotmarker,uint8_t numcsrcs,const uint32_t *csrcs,
		  bool gotextension,uint16_t extensionid,uint16_t extensionlen_numwords,const void *extensiondata,
		  size_t maxpacksize, RTPMemoryManager *mgr) : RTPMemoryObject(mgr),receivetime(0,0)
{
	Clear();
	error = BuildPacket(payloadtype,payloaddata,payloadlen,seqnr,timestamp,ssrc,gotmarker,numcsrcs,
	       	            csrcs,gotextension,extensionid,extensionlen_numwords,extensiondata,0,maxpacksize);
}